

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  size_t itime;
  ulong uVar20;
  BBox3fa *pBVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  undefined4 uVar27;
  BufferView<embree::Vec3fa> *pBVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  size_t sVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar53;
  float fVar54;
  vfloat4 a0;
  float fVar55;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  uint uVar57;
  uint uVar69;
  uint uVar70;
  Vec3fa n0;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar79;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar98;
  float fVar99;
  Vec3ff v3;
  float fVar100;
  float fVar101;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar97;
  float fVar109;
  float fVar111;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar110;
  float fVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar108;
  float fVar113;
  float fVar119;
  float fVar121;
  Vec3fa n1;
  float fVar114;
  float fVar115;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vfloat4 a_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar136;
  float fVar138;
  undefined1 auVar130 [16];
  uint uVar129;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar141;
  float fVar142;
  uint uVar143;
  float fVar146;
  float fVar147;
  float fVar149;
  undefined1 auVar144 [16];
  uint uVar148;
  uint uVar150;
  undefined1 auVar145 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  uint uVar158;
  uint uVar159;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar175;
  float fVar176;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  uint uVar178;
  float fVar181;
  uint uVar182;
  float fVar183;
  uint uVar184;
  uint uVar185;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 local_368 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  size_t local_270;
  size_t local_268;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar25 = r->_begin;
    local_268 = 0;
    local_208._8_8_ = 0xff800000ff800000;
    local_208._0_8_ = 0xff800000ff800000;
    local_218._8_8_ = 0x7f8000007f800000;
    local_218._0_8_ = 0x7f8000007f800000;
    local_228._8_8_ = 0xff800000ff800000;
    local_228._0_8_ = 0xff800000ff800000;
    local_238._8_8_ = 0x7f8000007f800000;
    local_238._0_8_ = 0x7f8000007f800000;
    local_270 = k;
    for (; uVar25 < r->_end; uVar25 = uVar25 + 1) {
      BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar92 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar35 = BVar4.lower;
      fVar56 = BVar4.upper - fVar35;
      fVar34 = ceilf(((fVar2 - fVar35) / fVar56) * 0.99999976 * fVar92);
      uVar22 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar25);
      uVar24 = (ulong)(uVar22 + 3);
      pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar24 < (pBVar5->super_RawBufferView).num) {
        if (fVar92 <= fVar34) {
          fVar34 = fVar92;
        }
        fVar35 = floorf(((fVar3 - fVar35) / fVar56) * 1.0000002 * fVar92);
        fVar56 = 0.0;
        if (0.0 <= fVar35) {
          fVar56 = fVar35;
        }
        uVar20 = (ulong)(int)fVar56;
        pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        fVar56 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        pBVar28 = pBVar6;
LAB_00245bbe:
        if ((ulong)(long)(int)fVar34 < uVar20) {
          local_f0.primID = &local_e0;
          fVar34 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar35 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar34;
          fVar175 = (fVar3 - fVar34) / fVar35;
          fVar35 = (fVar2 - fVar34) / fVar35;
          fVar172 = fVar92 * fVar35;
          local_f0.this = this;
          local_e0 = uVar25;
          fVar34 = floorf(fVar92 * fVar175);
          fVar56 = ceilf(fVar172);
          uVar22 = (uint)fVar34;
          if (fVar34 <= 0.0) {
            fVar34 = 0.0;
          }
          fVar176 = fVar56;
          if (fVar92 <= fVar56) {
            fVar176 = fVar92;
          }
          uVar23 = 0xffffffff;
          if (-1 < (int)uVar22) {
            uVar23 = uVar22;
          }
          iVar26 = (int)fVar92 + 1;
          if ((int)fVar56 < (int)fVar92 + 1) {
            iVar26 = (int)fVar56;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_f0,(long)(int)fVar34);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_f0,(long)(int)fVar176);
          fVar56 = fVar92 * fVar175 - fVar34;
          if (iVar26 - uVar23 == 1) {
            if (fVar56 <= 0.0) {
              fVar56 = 0.0;
            }
            fVar92 = 1.0 - fVar56;
            auVar130._0_4_ =
                 fVar92 * blower0.lower.field_0.m128[0] + fVar56 * bupper1.lower.field_0.m128[0];
            auVar130._4_4_ =
                 fVar92 * blower0.lower.field_0.m128[1] + fVar56 * bupper1.lower.field_0.m128[1];
            auVar130._8_4_ =
                 fVar92 * blower0.lower.field_0.m128[2] + fVar56 * bupper1.lower.field_0.m128[2];
            auVar130._12_4_ =
                 fVar92 * blower0.lower.field_0.m128[3] + fVar56 * bupper1.lower.field_0.m128[3];
            auVar62._0_4_ =
                 fVar92 * blower0.upper.field_0.m128[0] + fVar56 * bupper1.upper.field_0.m128[0];
            auVar62._4_4_ =
                 fVar92 * blower0.upper.field_0.m128[1] + fVar56 * bupper1.upper.field_0.m128[1];
            auVar62._8_4_ =
                 fVar92 * blower0.upper.field_0.m128[2] + fVar56 * bupper1.upper.field_0.m128[2];
            auVar62._12_4_ =
                 fVar92 * blower0.upper.field_0.m128[3] + fVar56 * bupper1.upper.field_0.m128[3];
            fVar92 = fVar176 - fVar172;
            if (fVar176 - fVar172 <= 0.0) {
              fVar92 = 0.0;
            }
            fVar34 = 1.0 - fVar92;
            auVar85._0_4_ =
                 bupper1.lower.field_0.m128[0] * fVar34 + blower0.lower.field_0.m128[0] * fVar92;
            auVar85._4_4_ =
                 bupper1.lower.field_0.m128[1] * fVar34 + blower0.lower.field_0.m128[1] * fVar92;
            auVar85._8_4_ =
                 bupper1.lower.field_0.m128[2] * fVar34 + blower0.lower.field_0.m128[2] * fVar92;
            auVar85._12_4_ =
                 bupper1.lower.field_0.m128[3] * fVar34 + blower0.lower.field_0.m128[3] * fVar92;
            auVar84._0_4_ =
                 fVar34 * bupper1.upper.field_0.m128[0] + fVar92 * blower0.upper.field_0.m128[0];
            auVar84._4_4_ =
                 fVar34 * bupper1.upper.field_0.m128[1] + fVar92 * blower0.upper.field_0.m128[1];
            auVar84._8_4_ =
                 fVar34 * bupper1.upper.field_0.m128[2] + fVar92 * blower0.upper.field_0.m128[2];
            auVar84._12_4_ =
                 fVar34 * bupper1.upper.field_0.m128[3] + fVar92 * blower0.upper.field_0.m128[3];
            uVar27 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_f0,(long)((int)fVar34 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_f0,(long)((int)fVar176 + -1));
            if (fVar56 <= 0.0) {
              fVar56 = 0.0;
            }
            fVar34 = 1.0 - fVar56;
            auVar130._0_4_ =
                 blower0.lower.field_0.m128[0] * fVar34 + blower1.lower.field_0.m128[0] * fVar56;
            auVar130._4_4_ =
                 blower0.lower.field_0.m128[1] * fVar34 + blower1.lower.field_0.m128[1] * fVar56;
            auVar130._8_4_ =
                 blower0.lower.field_0.m128[2] * fVar34 + blower1.lower.field_0.m128[2] * fVar56;
            auVar130._12_4_ =
                 blower0.lower.field_0.m128[3] * fVar34 + blower1.lower.field_0.m128[3] * fVar56;
            auVar62._0_4_ =
                 fVar34 * blower0.upper.field_0.m128[0] + fVar56 * blower1.upper.field_0.m128[0];
            auVar62._4_4_ =
                 fVar34 * blower0.upper.field_0.m128[1] + fVar56 * blower1.upper.field_0.m128[1];
            auVar62._8_4_ =
                 fVar34 * blower0.upper.field_0.m128[2] + fVar56 * blower1.upper.field_0.m128[2];
            auVar62._12_4_ =
                 fVar34 * blower0.upper.field_0.m128[3] + fVar56 * blower1.upper.field_0.m128[3];
            fVar34 = fVar176 - fVar172;
            if (fVar176 - fVar172 <= 0.0) {
              fVar34 = 0.0;
            }
            fVar56 = 1.0 - fVar34;
            auVar85._0_4_ =
                 bupper1.lower.field_0.m128[0] * fVar56 + bupper0.lower.field_0.m128[0] * fVar34;
            auVar85._4_4_ =
                 bupper1.lower.field_0.m128[1] * fVar56 + bupper0.lower.field_0.m128[1] * fVar34;
            auVar85._8_4_ =
                 bupper1.lower.field_0.m128[2] * fVar56 + bupper0.lower.field_0.m128[2] * fVar34;
            auVar85._12_4_ =
                 bupper1.lower.field_0.m128[3] * fVar56 + bupper0.lower.field_0.m128[3] * fVar34;
            auVar84._0_4_ =
                 fVar56 * bupper1.upper.field_0.m128[0] + fVar34 * bupper0.upper.field_0.m128[0];
            auVar84._4_4_ =
                 fVar56 * bupper1.upper.field_0.m128[1] + fVar34 * bupper0.upper.field_0.m128[1];
            auVar84._8_4_ =
                 fVar56 * bupper1.upper.field_0.m128[2] + fVar34 * bupper0.upper.field_0.m128[2];
            auVar84._12_4_ =
                 fVar56 * bupper1.upper.field_0.m128[3] + fVar34 * bupper0.upper.field_0.m128[3];
            pBVar21 = (BBox3fa *)(ulong)uVar22;
            if ((int)uVar22 < 0) {
              pBVar21 = (BBox3fa *)0xffffffff;
            }
            sVar32 = (size_t)(int)pBVar21;
            while( true ) {
              sVar32 = sVar32 + 1;
              uVar27 = SUB84(pBVar21,0);
              if ((long)iVar26 <= (long)sVar32) break;
              fVar34 = ((float)(int)sVar32 / fVar92 - fVar175) / (fVar35 - fVar175);
              fVar109 = 1.0 - fVar34;
              fVar56 = auVar85._4_4_;
              fVar172 = auVar85._8_4_;
              fVar176 = auVar85._12_4_;
              fVar111 = auVar130._4_4_;
              fVar79 = auVar130._8_4_;
              fVar36 = auVar130._12_4_;
              fVar100 = auVar84._4_4_;
              fVar91 = auVar84._8_4_;
              fVar110 = auVar84._12_4_;
              fVar37 = auVar62._4_4_;
              fVar101 = auVar62._8_4_;
              fVar90 = auVar62._12_4_;
              pBVar21 = linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_f0,sVar32);
              auVar132._0_4_ =
                   bi.lower.field_0.m128[0] - (auVar130._0_4_ * fVar109 + auVar85._0_4_ * fVar34);
              auVar132._4_4_ = bi.lower.field_0.m128[1] - (fVar111 * fVar109 + fVar56 * fVar34);
              auVar132._8_4_ = bi.lower.field_0.m128[2] - (fVar79 * fVar109 + fVar172 * fVar34);
              auVar132._12_4_ = bi.lower.field_0.m128[3] - (fVar36 * fVar109 + fVar176 * fVar34);
              auVar173._0_4_ =
                   bi.upper.field_0.m128[0] - (fVar109 * auVar62._0_4_ + fVar34 * auVar84._0_4_);
              auVar173._4_4_ = bi.upper.field_0.m128[1] - (fVar109 * fVar37 + fVar34 * fVar100);
              auVar173._8_4_ = bi.upper.field_0.m128[2] - (fVar109 * fVar101 + fVar34 * fVar91);
              auVar173._12_4_ = bi.upper.field_0.m128[3] - (fVar109 * fVar90 + fVar34 * fVar110);
              auVar132 = minps(auVar132,ZEXT816(0));
              auVar173 = maxps(auVar173,ZEXT816(0));
              auVar130._0_4_ = auVar130._0_4_ + auVar132._0_4_;
              auVar130._4_4_ = fVar111 + auVar132._4_4_;
              auVar130._8_4_ = fVar79 + auVar132._8_4_;
              auVar130._12_4_ = fVar36 + auVar132._12_4_;
              auVar85._0_4_ = auVar85._0_4_ + auVar132._0_4_;
              auVar85._4_4_ = fVar56 + auVar132._4_4_;
              auVar85._8_4_ = fVar172 + auVar132._8_4_;
              auVar85._12_4_ = fVar176 + auVar132._12_4_;
              auVar62._0_4_ = auVar62._0_4_ + auVar173._0_4_;
              auVar62._4_4_ = fVar37 + auVar173._4_4_;
              auVar62._8_4_ = fVar101 + auVar173._8_4_;
              auVar62._12_4_ = fVar90 + auVar173._12_4_;
              auVar84._0_4_ = auVar84._0_4_ + auVar173._0_4_;
              auVar84._4_4_ = fVar100 + auVar173._4_4_;
              auVar84._8_4_ = fVar91 + auVar173._8_4_;
              auVar84._12_4_ = fVar110 + auVar173._12_4_;
            }
          }
          auVar179._4_4_ = -(uint)(auVar130._4_4_ <= auVar62._4_4_);
          auVar179._0_4_ = -(uint)(auVar130._0_4_ <= auVar62._0_4_);
          auVar179._8_4_ = -(uint)(auVar130._8_4_ <= auVar62._8_4_);
          auVar179._12_4_ = -(uint)(auVar130._12_4_ <= auVar62._12_4_);
          uVar27 = movmskps(uVar27,auVar179);
          if (((~(byte)uVar27 & 7) == 0) &&
             (auVar118._4_4_ = -(uint)(auVar85._4_4_ <= auVar84._4_4_),
             auVar118._0_4_ = -(uint)(auVar85._0_4_ <= auVar84._0_4_),
             auVar118._8_4_ = -(uint)(auVar85._8_4_ <= auVar84._8_4_),
             auVar118._12_4_ = -(uint)(auVar85._12_4_ <= auVar84._12_4_),
             uVar27 = movmskps(CONCAT31((int3)((uint)uVar27 >> 8),~(byte)uVar27),auVar118),
             (~(byte)uVar27 & 7) == 0)) {
            auVar130 = minps(auVar130,auVar85);
            auVar62 = maxps(auVar62,auVar84);
            aVar108._0_12_ = auVar130._0_12_;
            aVar108.m128[3] = (float)geomID;
            aVar97._0_12_ = auVar62._0_12_;
            aVar97.m128[3] = (float)uVar25;
            auVar127._0_4_ = auVar130._0_4_ + auVar62._0_4_;
            auVar127._4_4_ = auVar130._4_4_ + auVar62._4_4_;
            auVar127._8_4_ = auVar130._8_4_ + auVar62._8_4_;
            auVar127._12_4_ = (float)geomID + (float)uVar25;
            local_238 = minps(local_238,(undefined1  [16])aVar108);
            local_228 = maxps(local_228,(undefined1  [16])aVar97);
            local_218 = minps(local_218,auVar127);
            local_208 = maxps(local_208,auVar127);
            local_268 = local_268 + 1;
            prims[local_270].lower.field_0 = aVar108;
            prims[local_270].upper.field_0 = aVar97;
            local_270 = local_270 + 1;
          }
        }
        else {
          pcVar7 = pBVar5[uVar20].super_RawBufferView.ptr_ofs;
          sVar32 = pBVar5[uVar20].super_RawBufferView.stride;
          lVar33 = sVar32 * uVar22;
          lVar31 = sVar32 * (uVar22 + 1);
          lVar30 = sVar32 * (uVar22 + 2);
          auVar157._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar31 + 0xc)));
          auVar157._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar33 + 0xc)));
          auVar157._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar30 + 0xc)));
          auVar157._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + sVar32 * uVar24 + 0xc)));
          iVar26 = movmskps((int)pBVar28,auVar157);
          if (iVar26 == 0) {
            auVar62 = *(undefined1 (*) [16])(pcVar7 + lVar33);
            fVar172 = auVar62._0_4_;
            fVar175 = auVar62._4_4_;
            fVar176 = auVar62._8_4_;
            fVar35 = auVar62._12_4_;
            auVar58._0_4_ = -(uint)(fVar172 < 1.844e+18 && -1.844e+18 < fVar172);
            auVar58._4_4_ = -(uint)(fVar175 < 1.844e+18 && -1.844e+18 < fVar175);
            auVar58._8_4_ = -(uint)(fVar176 < 1.844e+18 && -1.844e+18 < fVar176);
            auVar58._12_4_ = -(uint)(fVar35 < 1.844e+18 && -1.844e+18 < fVar35);
            uVar27 = movmskps(0,auVar58);
            if ((~(byte)uVar27 & 7) == 0) {
              pfVar1 = (float *)(pcVar7 + lVar31);
              fVar109 = *pfVar1;
              fVar111 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar36 = pfVar1[3];
              auVar59._0_4_ = -(uint)(fVar109 < 1.844e+18 && -1.844e+18 < fVar109);
              auVar59._4_4_ = -(uint)(fVar111 < 1.844e+18 && -1.844e+18 < fVar111);
              auVar59._8_4_ = -(uint)(fVar79 < 1.844e+18 && -1.844e+18 < fVar79);
              auVar59._12_4_ = -(uint)(fVar36 < 1.844e+18 && -1.844e+18 < fVar36);
              uVar27 = movmskps(CONCAT31((int3)((uint)uVar27 >> 8),~(byte)uVar27),auVar59);
              if ((~(byte)uVar27 & 7) == 0) {
                pfVar1 = (float *)(pcVar7 + lVar30);
                fVar100 = *pfVar1;
                fVar91 = pfVar1[1];
                fVar110 = pfVar1[2];
                fVar37 = pfVar1[3];
                auVar60._0_4_ = -(uint)(fVar100 < 1.844e+18 && -1.844e+18 < fVar100);
                auVar60._4_4_ = -(uint)(fVar91 < 1.844e+18 && -1.844e+18 < fVar91);
                auVar60._8_4_ = -(uint)(fVar110 < 1.844e+18 && -1.844e+18 < fVar110);
                auVar60._12_4_ = -(uint)(fVar37 < 1.844e+18 && -1.844e+18 < fVar37);
                uVar27 = movmskps(CONCAT31((int3)((uint)uVar27 >> 8),~(byte)uVar27),auVar60);
                if ((~(byte)uVar27 & 7) == 0) {
                  auVar62 = *(undefined1 (*) [16])(pcVar7 + sVar32 * uVar24);
                  fVar90 = auVar62._0_4_;
                  fVar98 = auVar62._4_4_;
                  fVar99 = auVar62._8_4_;
                  fVar101 = auVar62._12_4_;
                  auVar61._0_4_ = -(uint)(fVar90 < 1.844e+18 && -1.844e+18 < fVar90);
                  auVar61._4_4_ = -(uint)(fVar98 < 1.844e+18 && -1.844e+18 < fVar98);
                  auVar61._8_4_ = -(uint)(fVar99 < 1.844e+18 && -1.844e+18 < fVar99);
                  auVar61._12_4_ = -(uint)(fVar101 < 1.844e+18 && -1.844e+18 < fVar101);
                  uVar27 = movmskps(CONCAT31((int3)((uint)uVar27 >> 8),~(byte)uVar27),auVar61);
                  if ((~(byte)uVar27 & 7) == 0) {
                    pcVar7 = pBVar6[uVar20].super_RawBufferView.ptr_ofs;
                    sVar32 = pBVar6[uVar20].super_RawBufferView.stride;
                    lVar30 = sVar32 * uVar22;
                    pfVar1 = (float *)(pcVar7 + lVar30);
                    fVar112 = *pfVar1;
                    fVar115 = pfVar1[1];
                    fVar142 = pfVar1[2];
                    auVar102._0_4_ = -(uint)(fVar112 < 1.844e+18 && -1.844e+18 < fVar112);
                    auVar102._4_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
                    auVar102._8_4_ = -(uint)(fVar142 < 1.844e+18 && -1.844e+18 < fVar142);
                    auVar102._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                    uVar27 = movmskps((int)lVar30,auVar102);
                    if ((~(byte)uVar27 & 7) == 0) {
                      lVar30 = sVar32 * (uVar22 + 1);
                      auVar62 = *(undefined1 (*) [16])(pcVar7 + lVar30);
                      fVar113 = auVar62._0_4_;
                      fVar119 = auVar62._4_4_;
                      fVar147 = auVar62._8_4_;
                      auVar103._0_4_ = -(uint)(fVar113 < 1.844e+18 && -1.844e+18 < fVar113);
                      auVar103._4_4_ = -(uint)(fVar119 < 1.844e+18 && -1.844e+18 < fVar119);
                      auVar103._8_4_ = -(uint)(fVar147 < 1.844e+18 && -1.844e+18 < fVar147);
                      auVar103._12_4_ =
                           -(uint)(auVar62._12_4_ < 1.844e+18 && -1.844e+18 < auVar62._12_4_);
                      uVar27 = movmskps((int)lVar30,auVar103);
                      if ((~(byte)uVar27 & 7) == 0) goto code_r0x00245d3f;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00246c91:
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_238._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_238._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_228._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_228._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_218._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_218._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_208._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_208._8_8_;
    __return_storage_ptr__->end = local_268;
  }
  return __return_storage_ptr__;
code_r0x00245d3f:
  fVar35 = fVar35 * fVar56;
  fVar36 = fVar36 * fVar56;
  fVar37 = fVar37 * fVar56;
  fVar101 = fVar101 * fVar56;
  lVar30 = sVar32 * (uVar22 + 2);
  pfVar1 = (float *)(pcVar7 + lVar30);
  fVar151 = *pfVar1;
  fVar177 = pfVar1[1];
  fVar181 = pfVar1[2];
  pfVar1 = (float *)(pcVar7 + sVar32 * uVar24);
  fVar183 = *pfVar1;
  fVar122 = pfVar1[1];
  fVar124 = pfVar1[2];
  fVar38 = (fVar100 * 0.5 + fVar90 * 0.0 + fVar109 * 0.0) - fVar172 * 0.5;
  fVar53 = (fVar91 * 0.5 + fVar98 * 0.0 + fVar111 * 0.0) - fVar175 * 0.5;
  fVar54 = (fVar110 * 0.5 + fVar99 * 0.0 + fVar79 * 0.0) - fVar176 * 0.5;
  fVar55 = (fVar37 * 0.5 + fVar101 * 0.0 + fVar36 * 0.0) - fVar35 * 0.5;
  fVar128 = (fVar151 * 0.5 + fVar183 * 0.0 + fVar113 * 0.0) - fVar112 * 0.5;
  fVar136 = (fVar177 * 0.5 + fVar122 * 0.0 + fVar119 * 0.0) - fVar115 * 0.5;
  fVar138 = (fVar181 * 0.5 + fVar124 * 0.0 + fVar147 * 0.0) - fVar142 * 0.5;
  fVar160 = fVar100 * 0.0 + fVar90 * -0.0 + fVar109 + fVar172 * -0.0;
  fVar163 = fVar91 * 0.0 + fVar98 * -0.0 + fVar111 + fVar175 * -0.0;
  fVar166 = fVar110 * 0.0 + fVar99 * -0.0 + fVar79 + fVar176 * -0.0;
  fVar169 = fVar37 * 0.0 + fVar101 * -0.0 + fVar36 + fVar35 * -0.0;
  fVar141 = fVar151 * 0.0 + fVar183 * -0.0 + fVar113 + fVar112 * -0.0;
  fVar146 = fVar177 * 0.0 + fVar122 * -0.0 + fVar119 + fVar115 * -0.0;
  fVar149 = fVar181 * 0.0 + fVar124 * -0.0 + fVar147 + fVar142 * -0.0;
  fVar161 = fVar90 * -0.0 + fVar100 + fVar109 * 0.0 + fVar172 * -0.0;
  fVar164 = fVar98 * -0.0 + fVar91 + fVar111 * 0.0 + fVar175 * -0.0;
  fVar167 = fVar99 * -0.0 + fVar110 + fVar79 * 0.0 + fVar176 * -0.0;
  fVar170 = fVar101 * -0.0 + fVar37 + fVar36 * 0.0 + fVar35 * -0.0;
  fVar114 = fVar172 * 0.0 + ((fVar90 * 0.5 + fVar100 * 0.0) - fVar109 * 0.5);
  fVar120 = fVar175 * 0.0 + ((fVar98 * 0.5 + fVar91 * 0.0) - fVar111 * 0.5);
  fVar121 = fVar176 * 0.0 + ((fVar99 * 0.5 + fVar110 * 0.0) - fVar79 * 0.5);
  fVar123 = fVar35 * 0.0 + ((fVar101 * 0.5 + fVar37 * 0.0) - fVar36 * 0.5);
  fVar176 = fVar183 * -0.0 + fVar151 + fVar113 * 0.0 + fVar112 * -0.0;
  fVar109 = fVar122 * -0.0 + fVar177 + fVar119 * 0.0 + fVar115 * -0.0;
  fVar111 = fVar124 * -0.0 + fVar181 + fVar147 * 0.0 + fVar142 * -0.0;
  fVar35 = fVar112 * 0.0 + ((fVar183 * 0.5 + fVar151 * 0.0) - fVar113 * 0.5);
  fVar172 = fVar115 * 0.0 + ((fVar122 * 0.5 + fVar177 * 0.0) - fVar119 * 0.5);
  fVar175 = fVar142 * 0.0 + ((fVar124 * 0.5 + fVar181 * 0.0) - fVar147 * 0.5);
  fVar142 = fVar141 * fVar53 - fVar146 * fVar38;
  fVar147 = fVar146 * fVar54 - fVar149 * fVar53;
  fVar113 = fVar149 * fVar38 - fVar141 * fVar54;
  fVar91 = fVar53 * fVar128 - fVar136 * fVar38;
  fVar36 = fVar54 * fVar136 - fVar138 * fVar53;
  fVar100 = fVar38 * fVar138 - fVar128 * fVar54;
  fVar37 = fVar176 * fVar120 - fVar109 * fVar114;
  fVar110 = fVar109 * fVar121 - fVar111 * fVar120;
  fVar99 = fVar111 * fVar114 - fVar176 * fVar121;
  fVar176 = fVar120 * fVar35 - fVar172 * fVar114;
  fVar111 = fVar121 * fVar172 - fVar175 * fVar120;
  fVar79 = fVar114 * fVar175 - fVar35 * fVar121;
  fVar172 = fVar113 * fVar113 + fVar147 * fVar147 + fVar142 * fVar142;
  auVar130 = ZEXT416((uint)fVar172);
  auVar62 = rsqrtss(ZEXT416((uint)fVar172),auVar130);
  fVar35 = auVar62._0_4_;
  fVar175 = fVar35 * 1.5 - fVar35 * fVar35 * fVar172 * 0.5 * fVar35;
  fVar151 = fVar142 * fVar91 + fVar113 * fVar100 + fVar147 * fVar36;
  auVar62 = rcpss(auVar130,auVar130);
  fVar35 = (2.0 - fVar172 * auVar62._0_4_) * auVar62._0_4_;
  fVar115 = fVar99 * fVar99 + fVar110 * fVar110 + fVar37 * fVar37;
  auVar62 = ZEXT416((uint)fVar115);
  auVar130 = rsqrtss(ZEXT416((uint)fVar115),auVar62);
  fVar109 = auVar130._0_4_;
  fVar101 = fVar109 * 1.5 - fVar109 * fVar109 * fVar115 * 0.5 * fVar109;
  fVar119 = fVar37 * fVar176 + fVar99 * fVar79 + fVar110 * fVar111;
  auVar62 = rcpss(auVar62,auVar62);
  fVar109 = (2.0 - fVar115 * auVar62._0_4_) * auVar62._0_4_;
  fVar90 = fVar169 * fVar147 * fVar175;
  fVar98 = fVar169 * fVar113 * fVar175;
  fVar112 = fVar169 * fVar142 * fVar175;
  fVar177 = fVar160 - fVar90;
  fVar181 = fVar163 - fVar98;
  fVar183 = fVar166 - fVar112;
  fVar36 = fVar169 * fVar35 * (fVar172 * fVar36 - fVar151 * fVar147) * fVar175 +
           fVar55 * fVar147 * fVar175;
  fVar100 = fVar169 * fVar35 * (fVar172 * fVar100 - fVar151 * fVar113) * fVar175 +
            fVar55 * fVar113 * fVar175;
  fVar91 = fVar169 * fVar35 * (fVar172 * fVar91 - fVar151 * fVar142) * fVar175 +
           fVar55 * fVar142 * fVar175;
  fVar35 = fVar170 * fVar110 * fVar101;
  fVar172 = fVar170 * fVar99 * fVar101;
  fVar175 = fVar170 * fVar37 * fVar101;
  fVar142 = fVar161 - fVar35;
  fVar147 = fVar164 - fVar172;
  fVar113 = fVar167 - fVar175;
  fVar110 = fVar170 * fVar109 * (fVar115 * fVar111 - fVar119 * fVar110) * fVar101 +
            fVar123 * fVar110 * fVar101;
  fVar79 = fVar170 * fVar109 * (fVar115 * fVar79 - fVar119 * fVar99) * fVar101 +
           fVar123 * fVar99 * fVar101;
  fVar37 = fVar170 * fVar109 * (fVar115 * fVar176 - fVar119 * fVar37) * fVar101 +
           fVar123 * fVar37 * fVar101;
  fVar101 = (fVar38 - fVar36) * 0.33333334 + fVar177;
  fVar99 = (fVar53 - fVar100) * 0.33333334 + fVar181;
  fVar115 = (fVar54 - fVar91) * 0.33333334 + fVar183;
  fVar176 = fVar142 - (fVar114 - fVar110) * 0.33333334;
  fVar109 = fVar147 - (fVar120 - fVar79) * 0.33333334;
  fVar111 = fVar113 - (fVar121 - fVar37) * 0.33333334;
  uVar29 = 0;
  local_2e8 = 0xff800000;
  uStack_2e4 = 0xff800000;
  uStack_2e0 = 0xff800000;
  uStack_2dc = 0xff800000;
  local_318 = 0xff800000;
  uStack_314 = 0xff800000;
  uStack_310 = 0xff800000;
  uStack_30c = 0xff800000;
  local_338._8_8_ = 0xff800000ff800000;
  local_338._0_8_ = 0xff800000ff800000;
  local_348._8_8_ = 0x7f8000007f800000;
  local_348._0_8_ = 0x7f8000007f800000;
  local_2d8 = 0x7f800000;
  uStack_2d4 = 0x7f800000;
  uStack_2d0 = 0x7f800000;
  uStack_2cc = 0x7f800000;
  local_2f8 = 0x7f800000;
  uStack_2f4 = 0x7f800000;
  uStack_2f0 = 0x7f800000;
  uStack_2ec = 0x7f800000;
  while( true ) {
    uVar23 = local_338._0_4_;
    uVar158 = local_338._8_4_;
    uVar159 = local_338._12_4_;
    if (7 < uVar29) break;
    uVar185 = (uint)uVar29;
    uVar57 = -(uint)(-0x7ffffff9 < (int)(uVar185 ^ 0x80000000));
    uVar69 = -(uint)(-0x7ffffff9 < (int)(uVar185 ^ 0x80000000));
    uVar70 = -(uint)(-0x7ffffff9 < (int)(uVar185 ^ 0x80000000));
    uVar71 = -(uint)(-0x7ffffff9 < (int)(uVar185 ^ 0x80000000));
    lVar31 = uVar29 * 4;
    fVar119 = *(float *)(bezier_basis0 + lVar31 + 0x1dc);
    fVar151 = *(float *)(bezier_basis0 + lVar31 + 0x1e0);
    fVar122 = *(float *)(bezier_basis0 + lVar31 + 0x1e4);
    fVar124 = *(float *)(bezier_basis0 + lVar31 + 0x1e8);
    lVar31 = uVar29 * 4;
    fVar55 = *(float *)(bezier_basis0 + lVar31 + 0x660);
    fVar123 = *(float *)(bezier_basis0 + lVar31 + 0x664);
    fVar128 = *(float *)(bezier_basis0 + lVar31 + 0x668);
    fVar136 = *(float *)(bezier_basis0 + lVar31 + 0x66c);
    lVar31 = uVar29 * 4;
    fVar138 = *(float *)(bezier_basis0 + lVar31 + 0xae4);
    fVar141 = *(float *)(bezier_basis0 + lVar31 + 0xae8);
    fVar146 = *(float *)(bezier_basis0 + lVar31 + 0xaec);
    fVar149 = *(float *)(bezier_basis0 + lVar31 + 0xaf0);
    lVar31 = uVar29 * 4;
    fVar169 = *(float *)(bezier_basis0 + lVar31 + 0xf68);
    fVar170 = *(float *)(bezier_basis0 + lVar31 + 0xf6c);
    fVar8 = *(float *)(bezier_basis0 + lVar31 + 0xf70);
    fVar9 = *(float *)(bezier_basis0 + lVar31 + 0xf74);
    auVar80._0_4_ = fVar177 * fVar119 + fVar101 * fVar55 + fVar176 * fVar138 + fVar142 * fVar169;
    auVar80._4_4_ = fVar177 * fVar151 + fVar101 * fVar123 + fVar176 * fVar141 + fVar142 * fVar170;
    auVar80._8_4_ = fVar177 * fVar122 + fVar101 * fVar128 + fVar176 * fVar146 + fVar142 * fVar8;
    auVar80._12_4_ = fVar177 * fVar124 + fVar101 * fVar136 + fVar176 * fVar149 + fVar142 * fVar9;
    auVar125._0_4_ = fVar181 * fVar119 + fVar99 * fVar55 + fVar109 * fVar138 + fVar147 * fVar169;
    auVar125._4_4_ = fVar181 * fVar151 + fVar99 * fVar123 + fVar109 * fVar141 + fVar147 * fVar170;
    auVar125._8_4_ = fVar181 * fVar122 + fVar99 * fVar128 + fVar109 * fVar146 + fVar147 * fVar8;
    auVar125._12_4_ = fVar181 * fVar124 + fVar99 * fVar136 + fVar109 * fVar149 + fVar147 * fVar9;
    auVar93._0_4_ = fVar119 * fVar183 + fVar55 * fVar115 + fVar138 * fVar111 + fVar169 * fVar113;
    auVar93._4_4_ = fVar151 * fVar183 + fVar123 * fVar115 + fVar141 * fVar111 + fVar170 * fVar113;
    auVar93._8_4_ = fVar122 * fVar183 + fVar128 * fVar115 + fVar146 * fVar111 + fVar8 * fVar113;
    auVar93._12_4_ = fVar124 * fVar183 + fVar136 * fVar115 + fVar149 * fVar111 + fVar9 * fVar113;
    lVar31 = uVar29 * 4;
    fVar119 = *(float *)(bezier_basis0 + lVar31 + 0x13ec);
    fVar151 = *(float *)(bezier_basis0 + lVar31 + 0x13f0);
    fVar122 = *(float *)(bezier_basis0 + lVar31 + 0x13f4);
    fVar124 = *(float *)(bezier_basis0 + lVar31 + 0x13f8);
    lVar31 = uVar29 * 4;
    fVar55 = *(float *)(bezier_basis0 + lVar31 + 0x1870);
    fVar123 = *(float *)(bezier_basis0 + lVar31 + 0x1874);
    fVar128 = *(float *)(bezier_basis0 + lVar31 + 0x1878);
    fVar136 = *(float *)(bezier_basis0 + lVar31 + 0x187c);
    lVar31 = uVar29 * 4;
    fVar138 = *(float *)(bezier_basis0 + lVar31 + 0x1cf4);
    fVar141 = *(float *)(bezier_basis0 + lVar31 + 0x1cf8);
    fVar146 = *(float *)(bezier_basis0 + lVar31 + 0x1cfc);
    fVar149 = *(float *)(bezier_basis0 + lVar31 + 0x1d00);
    lVar31 = uVar29 * 4;
    fVar169 = *(float *)(bezier_basis0 + lVar31 + 0x2178);
    fVar170 = *(float *)(bezier_basis0 + lVar31 + 0x217c);
    fVar8 = *(float *)(bezier_basis0 + lVar31 + 0x2180);
    fVar9 = *(float *)(bezier_basis0 + lVar31 + 0x2184);
    fVar162 = fVar177 * fVar119 + fVar101 * fVar55 + fVar176 * fVar138 + fVar142 * fVar169;
    fVar165 = fVar177 * fVar151 + fVar101 * fVar123 + fVar176 * fVar141 + fVar142 * fVar170;
    fVar168 = fVar177 * fVar122 + fVar101 * fVar128 + fVar176 * fVar146 + fVar142 * fVar8;
    fVar171 = fVar177 * fVar124 + fVar101 * fVar136 + fVar176 * fVar149 + fVar142 * fVar9;
    fVar152 = fVar181 * fVar119 + fVar99 * fVar55 + fVar109 * fVar138 + fVar147 * fVar169;
    fVar153 = fVar181 * fVar151 + fVar99 * fVar123 + fVar109 * fVar141 + fVar147 * fVar170;
    fVar154 = fVar181 * fVar122 + fVar99 * fVar128 + fVar109 * fVar146 + fVar147 * fVar8;
    fVar155 = fVar181 * fVar124 + fVar99 * fVar136 + fVar109 * fVar149 + fVar147 * fVar9;
    fVar119 = fVar119 * fVar183 + fVar55 * fVar115 + fVar138 * fVar111 + fVar169 * fVar113;
    fVar151 = fVar151 * fVar183 + fVar123 * fVar115 + fVar141 * fVar111 + fVar170 * fVar113;
    fVar122 = fVar122 * fVar183 + fVar128 * fVar115 + fVar146 * fVar111 + fVar8 * fVar113;
    fVar124 = fVar124 * fVar183 + fVar136 * fVar115 + fVar149 * fVar111 + fVar9 * fVar113;
    uVar129 = -(uint)(uVar185 == 0);
    uVar137 = -(uint)(uVar185 == 1);
    uVar139 = -(uint)(uVar185 == 2);
    uVar140 = -(uint)(uVar185 == 3);
    uVar178 = -(uint)(uVar185 == 7);
    uVar182 = -(uint)(uVar185 == 6);
    uVar184 = -(uint)(uVar185 == 5);
    uVar185 = -(uint)(uVar185 == 4);
    local_328._4_4_ = (float)(~uVar182 & (uint)fVar165) * 0.055555556 + auVar80._4_4_;
    local_328._0_4_ = (float)(~uVar178 & (uint)fVar162) * 0.055555556 + auVar80._0_4_;
    fStack_320 = (float)(~uVar184 & (uint)fVar168) * 0.055555556 + auVar80._8_4_;
    fStack_31c = (float)(~uVar185 & (uint)fVar171) * 0.055555556 + auVar80._12_4_;
    auVar62 = minps(local_348,auVar80);
    auVar16._4_4_ = uStack_2e4;
    auVar16._0_4_ = local_2e8;
    auVar16._8_4_ = uStack_2e0;
    auVar16._12_4_ = uStack_2dc;
    auVar84 = maxps(auVar16,auVar80);
    auVar104._0_8_ =
         CONCAT44(auVar80._4_4_ - (float)(~uVar137 & (uint)fVar165) * 0.055555556,
                  auVar80._0_4_ - (float)(~uVar129 & (uint)fVar162) * 0.055555556);
    auVar104._8_4_ = auVar80._8_4_ - (float)(~uVar139 & (uint)fVar168) * 0.055555556;
    auVar104._12_4_ = auVar80._12_4_ - (float)(~uVar140 & (uint)fVar171) * 0.055555556;
    auVar144._0_4_ = (float)(~uVar178 & (uint)fVar152) * 0.055555556 + auVar125._0_4_;
    auVar144._4_4_ = (float)(~uVar182 & (uint)fVar153) * 0.055555556 + auVar125._4_4_;
    auVar144._8_4_ = (float)(~uVar184 & (uint)fVar154) * 0.055555556 + auVar125._8_4_;
    auVar144._12_4_ = (float)(~uVar185 & (uint)fVar155) * 0.055555556 + auVar125._12_4_;
    auVar18._4_4_ = uStack_2d4;
    auVar18._0_4_ = local_2d8;
    auVar18._8_4_ = uStack_2d0;
    auVar18._12_4_ = uStack_2cc;
    auVar85 = minps(auVar18,auVar125);
    auVar10._4_4_ = uStack_314;
    auVar10._0_4_ = local_318;
    auVar10._8_4_ = uStack_310;
    auVar10._12_4_ = uStack_30c;
    auVar179 = maxps(auVar10,auVar125);
    auVar126._0_8_ =
         CONCAT44(auVar125._4_4_ - (float)(~uVar137 & (uint)fVar153) * 0.055555556,
                  auVar125._0_4_ - (float)(~uVar129 & (uint)fVar152) * 0.055555556);
    auVar126._8_4_ = auVar125._8_4_ - (float)(~uVar139 & (uint)fVar154) * 0.055555556;
    auVar126._12_4_ = auVar125._12_4_ - (float)(~uVar140 & (uint)fVar155) * 0.055555556;
    auVar156._0_8_ =
         CONCAT44((float)(~uVar182 & (uint)fVar151) * 0.055555556 + auVar93._4_4_,
                  (float)(~uVar178 & (uint)fVar119) * 0.055555556 + auVar93._0_4_);
    auVar156._8_4_ = (float)(~uVar184 & (uint)fVar122) * 0.055555556 + auVar93._8_4_;
    auVar156._12_4_ = (float)(~uVar185 & (uint)fVar124) * 0.055555556 + auVar93._12_4_;
    auVar39._8_4_ = auVar156._8_4_;
    auVar39._0_8_ = auVar156._0_8_;
    auVar39._12_4_ = auVar156._12_4_;
    auVar14._4_4_ = uStack_2f4;
    auVar14._0_4_ = local_2f8;
    auVar14._8_4_ = uStack_2f0;
    auVar14._12_4_ = uStack_2ec;
    auVar130 = minps(auVar14,auVar93);
    auVar173 = maxps(local_338,auVar93);
    auVar94._0_8_ =
         CONCAT44(auVar93._4_4_ - (float)(~uVar137 & (uint)fVar151) * 0.055555556,
                  auVar93._0_4_ - (float)(~uVar129 & (uint)fVar119) * 0.055555556);
    auVar94._8_4_ = auVar93._8_4_ - (float)(~uVar139 & (uint)fVar122) * 0.055555556;
    auVar94._12_4_ = auVar93._12_4_ - (float)(~uVar140 & (uint)fVar124) * 0.055555556;
    auVar131._8_4_ = auVar104._8_4_;
    auVar131._0_8_ = auVar104._0_8_;
    auVar131._12_4_ = auVar104._12_4_;
    auVar132 = minps(auVar131,_local_328);
    auVar62 = minps(auVar62,auVar132);
    auVar133._8_4_ = auVar126._8_4_;
    auVar133._0_8_ = auVar126._0_8_;
    auVar133._12_4_ = auVar126._12_4_;
    auVar132 = minps(auVar133,auVar144);
    auVar85 = minps(auVar85,auVar132);
    auVar134._8_4_ = auVar94._8_4_;
    auVar134._0_8_ = auVar94._0_8_;
    auVar134._12_4_ = auVar94._12_4_;
    auVar132 = minps(auVar134,auVar39);
    auVar130 = minps(auVar130,auVar132);
    local_348._4_4_ = local_348._4_4_ & uVar69 | ~uVar69 & auVar62._4_4_;
    local_348._0_4_ = local_348._0_4_ & uVar57 | ~uVar57 & auVar62._0_4_;
    local_348._8_4_ = local_348._8_4_ & uVar70 | ~uVar70 & auVar62._8_4_;
    local_348._12_4_ = local_348._12_4_ & uVar71 | ~uVar71 & auVar62._12_4_;
    local_2d8 = local_2d8 & uVar57 | ~uVar57 & auVar85._0_4_;
    uStack_2d4 = uStack_2d4 & uVar69 | ~uVar69 & auVar85._4_4_;
    uStack_2d0 = uStack_2d0 & uVar70 | ~uVar70 & auVar85._8_4_;
    uStack_2cc = uStack_2cc & uVar71 | ~uVar71 & auVar85._12_4_;
    local_2f8 = local_2f8 & uVar57 | ~uVar57 & auVar130._0_4_;
    uStack_2f4 = uStack_2f4 & uVar69 | ~uVar69 & auVar130._4_4_;
    uStack_2f0 = uStack_2f0 & uVar70 | ~uVar70 & auVar130._8_4_;
    uStack_2ec = uStack_2ec & uVar71 | ~uVar71 & auVar130._12_4_;
    auVar62 = maxps(auVar104,_local_328);
    auVar62 = maxps(auVar84,auVar62);
    auVar130 = maxps(auVar126,auVar144);
    auVar84 = maxps(auVar179,auVar130);
    auVar130 = maxps(auVar94,auVar156);
    auVar130 = maxps(auVar173,auVar130);
    local_2e8 = local_2e8 & uVar57 | ~uVar57 & auVar62._0_4_;
    uStack_2e4 = uStack_2e4 & uVar69 | ~uVar69 & auVar62._4_4_;
    uStack_2e0 = uStack_2e0 & uVar70 | ~uVar70 & auVar62._8_4_;
    uStack_2dc = uStack_2dc & uVar71 | ~uVar71 & auVar62._12_4_;
    local_318 = local_318 & uVar57 | ~uVar57 & auVar84._0_4_;
    uStack_314 = uStack_314 & uVar69 | ~uVar69 & auVar84._4_4_;
    uStack_310 = uStack_310 & uVar70 | ~uVar70 & auVar84._8_4_;
    uStack_30c = uStack_30c & uVar71 | ~uVar71 & auVar84._12_4_;
    local_338._4_4_ = local_338._4_4_ & uVar69 | ~uVar69 & auVar130._4_4_;
    local_338._0_4_ = uVar23 & uVar57 | ~uVar57 & auVar130._0_4_;
    local_338._8_4_ = uVar158 & uVar70 | ~uVar70 & auVar130._8_4_;
    local_338._12_4_ = uVar159 & uVar71 | ~uVar71 & auVar130._12_4_;
    uVar29 = uVar29 + 4;
  }
  fVar160 = fVar160 + fVar90;
  fVar163 = fVar163 + fVar98;
  fVar166 = fVar166 + fVar112;
  fVar161 = fVar161 + fVar35;
  fVar164 = fVar164 + fVar172;
  fVar167 = fVar167 + fVar175;
  fVar35 = (fVar36 + fVar38) * 0.33333334 + fVar160;
  fVar172 = (fVar100 + fVar53) * 0.33333334 + fVar163;
  fVar175 = (fVar91 + fVar54) * 0.33333334 + fVar166;
  fVar176 = fVar161 - (fVar110 + fVar114) * 0.33333334;
  fVar109 = fVar164 - (fVar79 + fVar120) * 0.33333334;
  fVar111 = fVar167 - (fVar37 + fVar121) * 0.33333334;
  auVar40._4_4_ = local_348._0_4_;
  auVar40._0_4_ = local_348._4_4_;
  auVar40._8_4_ = local_348._12_4_;
  auVar40._12_4_ = local_348._8_4_;
  auVar62 = minps(auVar40,local_348);
  auVar63._0_8_ = auVar62._8_8_;
  auVar63._8_4_ = auVar62._0_4_;
  auVar63._12_4_ = auVar62._4_4_;
  auVar84 = minps(auVar63,auVar62);
  auVar19._4_4_ = uStack_2d4;
  auVar19._0_4_ = local_2d8;
  auVar19._8_4_ = uStack_2d0;
  auVar19._12_4_ = uStack_2cc;
  auVar41._4_4_ = local_2d8;
  auVar41._0_4_ = uStack_2d4;
  auVar41._8_4_ = uStack_2cc;
  auVar41._12_4_ = uStack_2d0;
  auVar62 = minps(auVar41,auVar19);
  auVar95._0_8_ = auVar62._8_8_;
  auVar95._8_4_ = auVar62._0_4_;
  auVar95._12_4_ = auVar62._4_4_;
  auVar62 = minps(auVar95,auVar62);
  auVar15._4_4_ = uStack_2f4;
  auVar15._0_4_ = local_2f8;
  auVar15._8_4_ = uStack_2f0;
  auVar15._12_4_ = uStack_2ec;
  auVar42._4_4_ = local_2f8;
  auVar42._0_4_ = uStack_2f4;
  auVar42._8_4_ = uStack_2ec;
  auVar42._12_4_ = uStack_2f0;
  auVar130 = minps(auVar42,auVar15);
  auVar43._0_8_ = auVar130._8_8_;
  auVar43._8_4_ = auVar130._0_4_;
  auVar43._12_4_ = auVar130._4_4_;
  auVar83._4_4_ = auVar62._0_4_;
  auVar83._0_4_ = auVar84._0_4_;
  auVar17._4_4_ = uStack_2e4;
  auVar17._0_4_ = local_2e8;
  auVar17._8_4_ = uStack_2e0;
  auVar17._12_4_ = uStack_2dc;
  auVar44._4_4_ = local_2e8;
  auVar44._0_4_ = uStack_2e4;
  auVar44._8_4_ = uStack_2dc;
  auVar44._12_4_ = uStack_2e0;
  auVar62 = maxps(auVar44,auVar17);
  auVar64._0_8_ = auVar62._8_8_;
  auVar64._8_4_ = auVar62._0_4_;
  auVar64._12_4_ = auVar62._4_4_;
  auVar84 = maxps(auVar64,auVar62);
  auVar11._4_4_ = uStack_314;
  auVar11._0_4_ = local_318;
  auVar11._8_4_ = uStack_310;
  auVar11._12_4_ = uStack_30c;
  auVar45._4_4_ = local_318;
  auVar45._0_4_ = uStack_314;
  auVar45._8_4_ = uStack_30c;
  auVar45._12_4_ = uStack_310;
  auVar62 = maxps(auVar45,auVar11);
  auVar96._0_8_ = auVar62._8_8_;
  auVar96._8_4_ = auVar62._0_4_;
  auVar96._12_4_ = auVar62._4_4_;
  auVar62 = maxps(auVar96,auVar62);
  auVar116._4_4_ = uVar23;
  auVar116._0_4_ = local_338._4_4_;
  auVar116._8_4_ = uVar159;
  auVar116._12_4_ = uVar158;
  auVar85 = maxps(auVar116,local_338);
  auVar117._0_8_ = auVar85._8_8_;
  auVar117._8_4_ = auVar85._0_4_;
  auVar117._12_4_ = auVar85._4_4_;
  auVar88._4_4_ = auVar62._0_4_;
  auVar88._0_4_ = auVar84._0_4_;
  uVar29 = 0;
  _local_328 = _DAT_01f45a40;
  local_368._8_8_ = 0x7f8000007f800000;
  local_368._0_8_ = 0x7f8000007f800000;
  local_318 = 0x7f800000;
  uStack_314 = 0x7f800000;
  uStack_310 = 0x7f800000;
  uStack_30c = 0x7f800000;
  local_338._8_8_ = 0x7f8000007f800000;
  local_338._0_8_ = 0x7f8000007f800000;
  auVar87 = _DAT_01f45a40;
  auVar62 = _DAT_01f45a40;
  while( true ) {
    uVar23 = local_328._0_4_;
    uVar158 = local_328._8_4_;
    uVar159 = local_328._12_4_;
    uVar185 = local_338._0_4_;
    uVar57 = local_338._8_4_;
    uVar69 = local_338._12_4_;
    if (7 < uVar29) break;
    uVar70 = (uint)uVar29;
    uVar71 = -(uint)(-0x7ffffff9 < (int)(uVar70 ^ 0x80000000));
    uVar129 = -(uint)(-0x7ffffff9 < (int)(uVar70 ^ 0x80000000));
    uVar137 = -(uint)(-0x7ffffff9 < (int)(uVar70 ^ 0x80000000));
    uVar139 = -(uint)(-0x7ffffff9 < (int)(uVar70 ^ 0x80000000));
    lVar31 = uVar29 * 4;
    fVar79 = *(float *)(bezier_basis0 + lVar31 + 0x1dc);
    fVar36 = *(float *)(bezier_basis0 + lVar31 + 0x1e0);
    fVar100 = *(float *)(bezier_basis0 + lVar31 + 0x1e4);
    fVar91 = *(float *)(bezier_basis0 + lVar31 + 0x1e8);
    lVar31 = uVar29 * 4;
    fVar110 = *(float *)(bezier_basis0 + lVar31 + 0x660);
    fVar37 = *(float *)(bezier_basis0 + lVar31 + 0x664);
    fVar101 = *(float *)(bezier_basis0 + lVar31 + 0x668);
    fVar90 = *(float *)(bezier_basis0 + lVar31 + 0x66c);
    lVar31 = uVar29 * 4;
    fVar98 = *(float *)(bezier_basis0 + lVar31 + 0xae4);
    fVar99 = *(float *)(bezier_basis0 + lVar31 + 0xae8);
    fVar112 = *(float *)(bezier_basis0 + lVar31 + 0xaec);
    fVar115 = *(float *)(bezier_basis0 + lVar31 + 0xaf0);
    lVar31 = uVar29 * 4;
    fVar142 = *(float *)(bezier_basis0 + lVar31 + 0xf68);
    fVar147 = *(float *)(bezier_basis0 + lVar31 + 0xf6c);
    fVar113 = *(float *)(bezier_basis0 + lVar31 + 0xf70);
    fVar119 = *(float *)(bezier_basis0 + lVar31 + 0xf74);
    auVar81._0_4_ = fVar160 * fVar79 + fVar35 * fVar110 + fVar176 * fVar98 + fVar161 * fVar142;
    auVar81._4_4_ = fVar160 * fVar36 + fVar35 * fVar37 + fVar176 * fVar99 + fVar161 * fVar147;
    auVar81._8_4_ = fVar160 * fVar100 + fVar35 * fVar101 + fVar176 * fVar112 + fVar161 * fVar113;
    auVar81._12_4_ = fVar160 * fVar91 + fVar35 * fVar90 + fVar176 * fVar115 + fVar161 * fVar119;
    auVar72._0_4_ = fVar163 * fVar79 + fVar172 * fVar110 + fVar109 * fVar98 + fVar164 * fVar142;
    auVar72._4_4_ = fVar163 * fVar36 + fVar172 * fVar37 + fVar109 * fVar99 + fVar164 * fVar147;
    auVar72._8_4_ = fVar163 * fVar100 + fVar172 * fVar101 + fVar109 * fVar112 + fVar164 * fVar113;
    auVar72._12_4_ = fVar163 * fVar91 + fVar172 * fVar90 + fVar109 * fVar115 + fVar164 * fVar119;
    local_128._0_4_ = fVar79 * fVar166 + fVar110 * fVar175 + fVar98 * fVar111 + fVar142 * fVar167;
    local_128._4_4_ = fVar36 * fVar166 + fVar37 * fVar175 + fVar99 * fVar111 + fVar147 * fVar167;
    fStack_120 = fVar100 * fVar166 + fVar101 * fVar175 + fVar112 * fVar111 + fVar113 * fVar167;
    fStack_11c = fVar91 * fVar166 + fVar90 * fVar175 + fVar115 * fVar111 + fVar119 * fVar167;
    lVar31 = uVar29 * 4;
    fVar79 = *(float *)(bezier_basis0 + lVar31 + 0x13ec);
    fVar36 = *(float *)(bezier_basis0 + lVar31 + 0x13f0);
    fVar100 = *(float *)(bezier_basis0 + lVar31 + 0x13f4);
    fVar91 = *(float *)(bezier_basis0 + lVar31 + 0x13f8);
    lVar31 = uVar29 * 4;
    fVar110 = *(float *)(bezier_basis0 + lVar31 + 0x1870);
    fVar37 = *(float *)(bezier_basis0 + lVar31 + 0x1874);
    fVar101 = *(float *)(bezier_basis0 + lVar31 + 0x1878);
    fVar90 = *(float *)(bezier_basis0 + lVar31 + 0x187c);
    lVar31 = uVar29 * 4;
    fVar98 = *(float *)(bezier_basis0 + lVar31 + 0x1cf4);
    fVar99 = *(float *)(bezier_basis0 + lVar31 + 0x1cf8);
    fVar112 = *(float *)(bezier_basis0 + lVar31 + 0x1cfc);
    fVar115 = *(float *)(bezier_basis0 + lVar31 + 0x1d00);
    lVar31 = uVar29 * 4;
    fVar142 = *(float *)(bezier_basis0 + lVar31 + 0x2178);
    fVar147 = *(float *)(bezier_basis0 + lVar31 + 0x217c);
    fVar113 = *(float *)(bezier_basis0 + lVar31 + 0x2180);
    fVar119 = *(float *)(bezier_basis0 + lVar31 + 0x2184);
    fVar122 = fVar160 * fVar79 + fVar35 * fVar110 + fVar176 * fVar98 + fVar161 * fVar142;
    fVar124 = fVar160 * fVar36 + fVar35 * fVar37 + fVar176 * fVar99 + fVar161 * fVar147;
    fVar38 = fVar160 * fVar100 + fVar35 * fVar101 + fVar176 * fVar112 + fVar161 * fVar113;
    fVar53 = fVar160 * fVar91 + fVar35 * fVar90 + fVar176 * fVar115 + fVar161 * fVar119;
    fVar151 = fVar163 * fVar79 + fVar172 * fVar110 + fVar109 * fVar98 + fVar164 * fVar142;
    fVar177 = fVar163 * fVar36 + fVar172 * fVar37 + fVar109 * fVar99 + fVar164 * fVar147;
    fVar181 = fVar163 * fVar100 + fVar172 * fVar101 + fVar109 * fVar112 + fVar164 * fVar113;
    fVar183 = fVar163 * fVar91 + fVar172 * fVar90 + fVar109 * fVar115 + fVar164 * fVar119;
    fVar79 = fVar79 * fVar166 + fVar110 * fVar175 + fVar98 * fVar111 + fVar142 * fVar167;
    fVar36 = fVar36 * fVar166 + fVar37 * fVar175 + fVar99 * fVar111 + fVar147 * fVar167;
    fVar100 = fVar100 * fVar166 + fVar101 * fVar175 + fVar112 * fVar111 + fVar113 * fVar167;
    fVar91 = fVar91 * fVar166 + fVar90 * fVar175 + fVar115 * fVar111 + fVar119 * fVar167;
    uVar140 = -(uint)(uVar70 == 0);
    uVar178 = -(uint)(uVar70 == 1);
    uVar182 = -(uint)(uVar70 == 2);
    uVar184 = -(uint)(uVar70 == 3);
    uVar143 = -(uint)(uVar70 == 7);
    uVar148 = -(uint)(uVar70 == 6);
    uVar150 = -(uint)(uVar70 == 5);
    uVar70 = -(uint)(uVar70 == 4);
    auVar46._0_4_ = (float)(~uVar143 & (uint)fVar122) * 0.055555556 + auVar81._0_4_;
    auVar46._4_4_ = (float)(~uVar148 & (uint)fVar124) * 0.055555556 + auVar81._4_4_;
    auVar46._8_4_ = (float)(~uVar150 & (uint)fVar38) * 0.055555556 + auVar81._8_4_;
    auVar46._12_4_ = (float)(~uVar70 & (uint)fVar53) * 0.055555556 + auVar81._12_4_;
    auVar157 = minps(local_368,auVar81);
    auVar132 = maxps(_local_328,auVar81);
    auVar174._0_8_ =
         CONCAT44(auVar81._4_4_ - (float)(~uVar178 & (uint)fVar124) * 0.055555556,
                  auVar81._0_4_ - (float)(~uVar140 & (uint)fVar122) * 0.055555556);
    auVar174._8_4_ = auVar81._8_4_ - (float)(~uVar182 & (uint)fVar38) * 0.055555556;
    auVar174._12_4_ = auVar81._12_4_ - (float)(~uVar184 & (uint)fVar53) * 0.055555556;
    auVar82._0_4_ = (float)(~uVar143 & (uint)fVar151) * 0.055555556 + auVar72._0_4_;
    auVar82._4_4_ = (float)(~uVar148 & (uint)fVar177) * 0.055555556 + auVar72._4_4_;
    auVar82._8_4_ = (float)(~uVar150 & (uint)fVar181) * 0.055555556 + auVar72._8_4_;
    auVar82._12_4_ = (float)(~uVar70 & (uint)fVar183) * 0.055555556 + auVar72._12_4_;
    auVar12._4_4_ = uStack_314;
    auVar12._0_4_ = local_318;
    auVar12._8_4_ = uStack_310;
    auVar12._12_4_ = uStack_30c;
    auVar84 = minps(auVar12,auVar72);
    auVar127 = maxps(auVar62,auVar72);
    auVar73._0_8_ =
         CONCAT44(auVar72._4_4_ - (float)(~uVar178 & (uint)fVar177) * 0.055555556,
                  auVar72._0_4_ - (float)(~uVar140 & (uint)fVar151) * 0.055555556);
    auVar73._8_4_ = auVar72._8_4_ - (float)(~uVar182 & (uint)fVar181) * 0.055555556;
    auVar73._12_4_ = auVar72._12_4_ - (float)(~uVar184 & (uint)fVar183) * 0.055555556;
    auVar145._0_4_ = (float)(~uVar143 & (uint)fVar79) * 0.055555556 + (float)local_128._0_4_;
    auVar145._4_4_ = (float)(~uVar148 & (uint)fVar36) * 0.055555556 + (float)local_128._4_4_;
    auVar145._8_4_ = (float)(~uVar150 & (uint)fVar100) * 0.055555556 + fStack_120;
    auVar145._12_4_ = (float)(~uVar70 & (uint)fVar91) * 0.055555556 + fStack_11c;
    auVar118 = minps(local_338,_local_128);
    auVar173 = maxps(auVar87,_local_128);
    auVar180._0_8_ =
         CONCAT44((float)local_128._4_4_ - (float)(~uVar178 & (uint)fVar36) * 0.055555556,
                  (float)local_128._0_4_ - (float)(~uVar140 & (uint)fVar79) * 0.055555556);
    auVar180._8_4_ = fStack_120 - (float)(~uVar182 & (uint)fVar100) * 0.055555556;
    auVar180._12_4_ = fStack_11c - (float)(~uVar184 & (uint)fVar91) * 0.055555556;
    auVar105._8_4_ = auVar174._8_4_;
    auVar105._0_8_ = auVar174._0_8_;
    auVar105._12_4_ = auVar174._12_4_;
    auVar179 = minps(auVar105,auVar46);
    auVar157 = minps(auVar157,auVar179);
    auVar106._8_4_ = auVar73._8_4_;
    auVar106._0_8_ = auVar73._0_8_;
    auVar106._12_4_ = auVar73._12_4_;
    auVar179 = minps(auVar106,auVar82);
    auVar84 = minps(auVar84,auVar179);
    auVar107._8_4_ = auVar180._8_4_;
    auVar107._0_8_ = auVar180._0_8_;
    auVar107._12_4_ = auVar180._12_4_;
    auVar179 = minps(auVar107,auVar145);
    auVar179 = minps(auVar118,auVar179);
    local_368._4_4_ = local_368._4_4_ & uVar129 | ~uVar129 & auVar157._4_4_;
    local_368._0_4_ = local_368._0_4_ & uVar71 | ~uVar71 & auVar157._0_4_;
    local_368._8_4_ = local_368._8_4_ & uVar137 | ~uVar137 & auVar157._8_4_;
    local_368._12_4_ = local_368._12_4_ & uVar139 | ~uVar139 & auVar157._12_4_;
    local_318 = local_318 & uVar71 | ~uVar71 & auVar84._0_4_;
    uStack_314 = uStack_314 & uVar129 | ~uVar129 & auVar84._4_4_;
    uStack_310 = uStack_310 & uVar137 | ~uVar137 & auVar84._8_4_;
    uStack_30c = uStack_30c & uVar139 | ~uVar139 & auVar84._12_4_;
    local_338._4_4_ = local_338._4_4_ & uVar129 | ~uVar129 & auVar179._4_4_;
    local_338._0_4_ = uVar185 & uVar71 | ~uVar71 & auVar179._0_4_;
    local_338._8_4_ = uVar57 & uVar137 | ~uVar137 & auVar179._8_4_;
    local_338._12_4_ = uVar69 & uVar139 | ~uVar139 & auVar179._12_4_;
    auVar84 = maxps(auVar174,auVar46);
    auVar84 = maxps(auVar132,auVar84);
    auVar132 = maxps(auVar73,auVar82);
    auVar179 = maxps(auVar127,auVar132);
    auVar132 = maxps(auVar180,auVar145);
    auVar132 = maxps(auVar173,auVar132);
    local_328._4_4_ = local_328._4_4_ & uVar129 | ~uVar129 & auVar84._4_4_;
    local_328._0_4_ = uVar23 & uVar71 | ~uVar71 & auVar84._0_4_;
    fStack_320 = (float)(uVar158 & uVar137 | ~uVar137 & auVar84._8_4_);
    fStack_31c = (float)(uVar159 & uVar139 | ~uVar139 & auVar84._12_4_);
    auVar74._0_4_ = ~uVar71 & auVar179._0_4_;
    auVar74._4_4_ = ~uVar129 & auVar179._4_4_;
    auVar74._8_4_ = ~uVar137 & auVar179._8_4_;
    auVar74._12_4_ = ~uVar139 & auVar179._12_4_;
    auVar135._0_4_ = auVar62._0_4_ & uVar71;
    auVar135._4_4_ = auVar62._4_4_ & uVar129;
    auVar135._8_4_ = auVar62._8_4_ & uVar137;
    auVar135._12_4_ = auVar62._12_4_ & uVar139;
    auVar62 = auVar135 | auVar74;
    auVar86._0_4_ = auVar87._0_4_ & uVar71;
    auVar86._4_4_ = auVar87._4_4_ & uVar129;
    auVar86._8_4_ = auVar87._8_4_ & uVar137;
    auVar86._12_4_ = auVar87._12_4_ & uVar139;
    auVar87._0_4_ = ~uVar71 & auVar132._0_4_;
    auVar87._4_4_ = ~uVar129 & auVar132._4_4_;
    auVar87._8_4_ = ~uVar137 & auVar132._8_4_;
    auVar87._12_4_ = ~uVar139 & auVar132._12_4_;
    auVar87 = auVar86 | auVar87;
    uVar29 = uVar29 + 4;
  }
  auVar130 = minps(auVar43,auVar130);
  auVar83._8_4_ = auVar130._0_4_;
  auVar83._12_4_ = 0;
  auVar130 = maxps(auVar117,auVar85);
  auVar88._8_4_ = auVar130._0_4_;
  auVar88._12_4_ = 0;
  auVar47._4_4_ = local_368._0_4_;
  auVar47._0_4_ = local_368._4_4_;
  auVar47._8_4_ = local_368._12_4_;
  auVar47._12_4_ = local_368._8_4_;
  auVar130 = minps(auVar47,local_368);
  auVar65._0_8_ = auVar130._8_8_;
  auVar65._8_4_ = auVar130._0_4_;
  auVar65._12_4_ = auVar130._4_4_;
  auVar84 = minps(auVar65,auVar130);
  auVar13._4_4_ = uStack_314;
  auVar13._0_4_ = local_318;
  auVar13._8_4_ = uStack_310;
  auVar13._12_4_ = uStack_30c;
  auVar48._4_4_ = local_318;
  auVar48._0_4_ = uStack_314;
  auVar48._8_4_ = uStack_30c;
  auVar48._12_4_ = uStack_310;
  auVar130 = minps(auVar48,auVar13);
  auVar75._0_8_ = auVar130._8_8_;
  auVar75._8_4_ = auVar130._0_4_;
  auVar75._12_4_ = auVar130._4_4_;
  auVar85 = minps(auVar75,auVar130);
  auVar49._4_4_ = uVar185;
  auVar49._0_4_ = local_338._4_4_;
  auVar49._8_4_ = uVar69;
  auVar49._12_4_ = uVar57;
  auVar130 = minps(auVar49,local_338);
  auVar66._0_8_ = auVar130._8_8_;
  auVar66._8_4_ = auVar130._0_4_;
  auVar66._12_4_ = auVar130._4_4_;
  auVar130 = minps(auVar66,auVar130);
  auVar76._4_4_ = auVar85._0_4_;
  auVar76._0_4_ = auVar84._0_4_;
  auVar76._8_4_ = auVar130._0_4_;
  auVar76._12_4_ = 0;
  auVar85 = minps(auVar83,auVar76);
  auVar50._4_4_ = uVar23;
  auVar50._0_4_ = local_328._4_4_;
  auVar50._8_4_ = uVar159;
  auVar50._12_4_ = uVar158;
  auVar130 = maxps(auVar50,_local_328);
  auVar67._0_8_ = auVar130._8_8_;
  auVar67._8_4_ = auVar130._0_4_;
  auVar67._12_4_ = auVar130._4_4_;
  auVar130 = maxps(auVar67,auVar130);
  auVar51._4_4_ = auVar62._0_4_;
  auVar51._0_4_ = auVar62._4_4_;
  auVar51._8_4_ = auVar62._12_4_;
  auVar51._12_4_ = auVar62._8_4_;
  auVar62 = maxps(auVar51,auVar62);
  auVar77._0_8_ = auVar62._8_8_;
  auVar77._8_4_ = auVar62._0_4_;
  auVar77._12_4_ = auVar62._4_4_;
  auVar84 = maxps(auVar77,auVar62);
  auVar52._4_4_ = auVar87._0_4_;
  auVar52._0_4_ = auVar87._4_4_;
  auVar52._8_4_ = auVar87._12_4_;
  auVar52._12_4_ = auVar87._8_4_;
  auVar62 = maxps(auVar52,auVar87);
  auVar68._0_8_ = auVar62._8_8_;
  auVar68._8_4_ = auVar62._0_4_;
  auVar68._12_4_ = auVar62._4_4_;
  auVar62 = maxps(auVar68,auVar62);
  auVar78._4_4_ = auVar84._0_4_;
  auVar78._0_4_ = auVar130._0_4_;
  auVar78._8_4_ = auVar62._0_4_;
  auVar78._12_4_ = 0;
  auVar62 = maxps(auVar88,auVar78);
  auVar89._0_4_ = -(uint)(auVar62._0_4_ < 1.844e+18 && -1.844e+18 < auVar85._0_4_);
  auVar89._4_4_ = -(uint)(auVar62._4_4_ < 1.844e+18 && -1.844e+18 < auVar85._4_4_);
  auVar89._8_4_ = -(uint)(auVar62._8_4_ < 1.844e+18 && -1.844e+18 < auVar85._8_4_);
  auVar89._12_4_ = -(uint)(auVar62._12_4_ < 1.844e+18 && -1.844e+18 < auVar85._12_4_);
  uVar27 = movmskps((int)lVar30,auVar89);
  pBVar28 = (BufferView<embree::Vec3fa> *)(ulong)CONCAT31((int3)((uint)uVar27 >> 8),~(byte)uVar27);
  uVar20 = uVar20 + 1;
  if ((~(byte)uVar27 & 7) != 0) goto LAB_00246c91;
  goto LAB_00245bbe;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }